

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhysicalDevice.cpp
# Opt level: O2

void __thiscall
myvk::PhysicalDevice::PhysicalDevice
          (PhysicalDevice *this,Ptr<Instance> *instance,VkPhysicalDevice physical_device)

{
  _Rb_tree_header *p_Var1;
  mapped_type_conflict mVar2;
  pointer pVVar3;
  mapped_type_conflict *pmVar4;
  pointer __s;
  uint32_t count_1;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> extensions;
  VkPhysicalDeviceFeatures2 features2;
  allocator<char> local_3b5;
  uint local_3b4;
  vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> *local_3b0;
  _Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> local_3a8;
  PhysicalDevice *local_390;
  PhysicalDeviceProperties *local_388;
  PhysicalDeviceFeatures *local_380;
  VkPhysicalDeviceProperties2 local_378;
  
  (this->super_Base).super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_Base).super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Base)._vptr_Base = (_func_int **)&PTR__PhysicalDevice_00322480;
  memset(&this->m_instance_ptr,0,0x220);
  local_380 = &this->m_features;
  PhysicalDeviceFeatures::PhysicalDeviceFeatures(&this->m_features);
  local_388 = &this->m_properties;
  PhysicalDeviceProperties::PhysicalDeviceProperties(local_388);
  local_3b0 = &this->m_queue_family_properties;
  (this->m_queue_family_properties).
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_queue_family_properties).
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_queue_family_properties).
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->m_extensions)._M_t._M_impl.super__Rb_tree_header;
  (this->m_extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_extensions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_instance_ptr).super___shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>,
             &instance->super___shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>);
  this->m_physical_device = physical_device;
  local_390 = this;
  (*vkGetPhysicalDeviceMemoryProperties)(physical_device,&this->m_memory_properties);
  memset(&local_378,0,0xf0);
  local_378.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2;
  local_378.pNext = &(this->m_features).vk11;
  (*vkGetPhysicalDeviceFeatures2)(physical_device,(VkPhysicalDeviceFeatures2 *)&local_378);
  memcpy(local_380,&local_378.properties,0xdc);
  memset(&local_378,0,0x348);
  local_378.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2;
  local_378.pNext = &(this->m_properties).vk11;
  (*vkGetPhysicalDeviceProperties2)(physical_device,&local_378);
  memcpy(local_388,&local_378.properties,0x338);
  (*vkGetPhysicalDeviceQueueFamilyProperties)
            (physical_device,&local_378.sType,(VkQueueFamilyProperties *)0x0);
  std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::resize
            (local_3b0,(ulong)local_378.sType);
  (*vkGetPhysicalDeviceQueueFamilyProperties)
            (physical_device,&local_378.sType,
             (local_3b0->
             super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>).
             _M_impl.super__Vector_impl_data._M_start);
  local_3a8._M_impl.super__Vector_impl_data._M_start = (VkExtensionProperties *)0x0;
  local_3a8._M_impl.super__Vector_impl_data._M_finish = (VkExtensionProperties *)0x0;
  local_3a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*vkEnumerateDeviceExtensionProperties)
            (physical_device,(char *)0x0,&local_3b4,(VkExtensionProperties *)0x0);
  std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::resize
            ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)&local_3a8,
             (ulong)local_3b4);
  (*vkEnumerateDeviceExtensionProperties)
            (physical_device,(char *)0x0,&local_3b4,
             local_3a8._M_impl.super__Vector_impl_data._M_start);
  pVVar3 = local_3a8._M_impl.super__Vector_impl_data._M_finish;
  for (__s = local_3a8._M_impl.super__Vector_impl_data._M_start; __s != pVVar3; __s = __s + 1) {
    mVar2 = __s->specVersion;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_378,__s->extensionName,&local_3b5);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::operator[](&this->m_extensions,(key_type *)&local_378);
    *pmVar4 = mVar2;
    std::__cxx11::string::~string((string *)&local_378);
  }
  std::_Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::~_Vector_base
            (&local_3a8);
  return;
}

Assistant:

PhysicalDevice::PhysicalDevice(const Ptr<Instance> &instance, VkPhysicalDevice physical_device) {
	m_instance_ptr = instance;
	m_physical_device = physical_device;
	vkGetPhysicalDeviceMemoryProperties(physical_device, &m_memory_properties);
	{
		VkPhysicalDeviceFeatures2 features2{VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2, &m_features.vk11};
		vkGetPhysicalDeviceFeatures2(physical_device, &features2);
		m_features.vk10 = features2.features;
	}
	{
		VkPhysicalDeviceProperties2 properties2{VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2, &m_properties.vk11};
		vkGetPhysicalDeviceProperties2(physical_device, &properties2);
		m_properties.vk10 = properties2.properties;
	}
	{
		uint32_t count;
		vkGetPhysicalDeviceQueueFamilyProperties(physical_device, &count, nullptr);
		m_queue_family_properties.resize(count);
		vkGetPhysicalDeviceQueueFamilyProperties(physical_device, &count, m_queue_family_properties.data());
	}
	{
		uint32_t count;
		std::vector<VkExtensionProperties> extensions;
		vkEnumerateDeviceExtensionProperties(physical_device, nullptr, &count, nullptr);
		extensions.resize(count);
		vkEnumerateDeviceExtensionProperties(physical_device, nullptr, &count, extensions.data());
		for (const auto &e : extensions)
			m_extensions[e.extensionName] = e.specVersion;
	}
}